

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint __thiscall ON_MeshComponentRef::GetMeshFace(ON_MeshComponentRef *this,ON_MeshFace **mesh_face)

{
  uint uVar1;
  TYPE TVar2;
  ON_Mesh *this_00;
  ON_MeshNgon *pOVar3;
  
  this_00 = this->m_mesh;
  if (this_00 != (ON_Mesh *)0x0) {
    uVar1 = (this->m_mesh_ci).m_index;
    if (-1 < (long)(int)uVar1) {
      TVar2 = (this->m_mesh_ci).m_type;
      if (TVar2 == mesh_ngon) {
        pOVar3 = ON_Mesh::Ngon(this_00,uVar1);
        if (((pOVar3 != (ON_MeshNgon *)0x0) && (pOVar3->m_Fcount == 1)) &&
           (pOVar3->m_fi != (uint *)0x0)) {
          uVar1 = *pOVar3->m_fi;
          if (uVar1 < (uint)(this->m_mesh->m_F).m_count) {
            *mesh_face = (this->m_mesh->m_F).m_a + uVar1;
            return *pOVar3->m_fi;
          }
        }
      }
      else if ((TVar2 == mesh_face) && ((int)uVar1 < (this_00->m_F).m_count)) {
        *mesh_face = (this_00->m_F).m_a + (int)uVar1;
        return uVar1;
      }
    }
  }
  *mesh_face = (ON_MeshFace *)0x0;
  return 0xffffffff;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshFace(
  const ON_MeshFace*& mesh_face
  ) const
{
  if ( 0 != m_mesh && m_mesh_ci.m_index >= 0 )
  {
    switch(m_mesh_ci.m_type)
    {     
    case ON_COMPONENT_INDEX::mesh_face:
      if ( m_mesh_ci.m_index < m_mesh->m_F.Count() )
      {
        mesh_face = &m_mesh->m_F[m_mesh_ci.m_index];
        return (unsigned int)m_mesh_ci.m_index;
      }
      break;

    case ON_COMPONENT_INDEX::mesh_ngon:
      {
        const ON_MeshNgon* ngon = m_mesh->Ngon(m_mesh_ci.m_index);
        if ( 0 != ngon && 1 == ngon->m_Fcount && 0 != ngon->m_fi )
        {
          if ( ngon->m_fi[0] < m_mesh->m_F.UnsignedCount() )
          {
            mesh_face = &m_mesh->m_F[ngon->m_fi[0]];
            return ngon->m_fi[0];
          }
        }
      }
      break;
    
    default:
      break;
    }
  }

  mesh_face = 0;
  return ON_UNSET_UINT_INDEX;
}